

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_soft_max_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *mask,float scale,float max_bias,
                  _Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  float in_XMM1_Da;
  float params [2];
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffb8;
  ggml_context *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ggml_context *in_stack_ffffffffffffffd0;
  
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x14ed41);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd7f
               ,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  if (in_RDX != (ggml_tensor *)0x0) {
    if ((in_RDX->type != GGML_TYPE_F16) && (in_RDX->type != GGML_TYPE_F32)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xd82,"GGML_ASSERT(%s) failed",
                 "mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32");
    }
    _Var1 = ggml_is_contiguous((ggml_tensor *)0x14edb1);
    if (!_Var1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xd83,"GGML_ASSERT(%s) failed","ggml_is_contiguous(mask)");
    }
    _Var1 = ggml_is_matrix(in_RDX);
    if (!_Var1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xd84,"GGML_ASSERT(%s) failed","ggml_is_matrix(mask)");
    }
    if (in_RDX->ne[0] != in_RSI->ne[0]) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xd85,"GGML_ASSERT(%s) failed","mask->ne[0] == a->ne[0]");
    }
    if (in_RDX->ne[1] < in_RSI->ne[1]) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0xd86,"GGML_ASSERT(%s) failed","mask->ne[1] >= a->ne[1]");
    }
  }
  if ((0.0 < in_XMM1_Da) && (in_RDX == (ggml_tensor *)0x0)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd8a
               ,"GGML_ASSERT(%s) failed","mask");
  }
  if ((in_CL & 1) == 0) {
    tensor = ggml_dup_tensor(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    tensor = ggml_view_tensor(in_stack_ffffffffffffffd0,
                              (ggml_tensor *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  ggml_set_op_params(tensor,in_stack_ffffffffffffffb8,0x14ef11);
  tensor->op = GGML_OP_SOFT_MAX;
  tensor->src[0] = in_RSI;
  tensor->src[1] = in_RDX;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_soft_max_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_contiguous(a));

    if (mask) {
        GGML_ASSERT(mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32);
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(ggml_is_matrix(mask));
        GGML_ASSERT(mask->ne[0] == a->ne[0]);
        GGML_ASSERT(mask->ne[1] >= a->ne[1]);
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    float params[] = { scale, max_bias };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SOFT_MAX;
    result->src[0] = a;
    result->src[1] = mask;

    return result;
}